

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall
cfd::core::ByteData256::ByteData256
          (ByteData256 *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *vector)

{
  size_type sVar1;
  undefined8 uVar2;
  ByteData256 *unaff_RBP;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *unaff_retaddr;
  ByteData256 *__n;
  CfdError error_code;
  CfdException *this_00;
  allocator local_71;
  string local_70 [32];
  size_type local_50;
  CfdSourceLocation local_48;
  undefined1 local_19 [9];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vector_local;
  ByteData256 *this_local;
  
  this_00 = (CfdException *)local_19;
  __n = this;
  local_19._1_8_ = vector;
  vector_local = &this->data_;
  this_local = unaff_RBP;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3e62ff);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(size_type)__n,
             (allocator_type *)this);
  error_code = (CfdError)((ulong)__n >> 0x20);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3e631c);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_19._1_8_);
  if (sVar1 != 0x20) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_bytedata.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0xfc;
    local_48.funcname = "ByteData256";
    local_50 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_19._1_8_);
    logger::warn<unsigned_long>(&local_48,"ByteData256 size unmatch. size={}.",&local_50);
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_70,"ByteData256 size unmatch.",&local_71);
    CfdException::CfdException(this_00,error_code,(string *)this);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (unaff_retaddr,&this_local->data_);
  return;
}

Assistant:

ByteData256::ByteData256(const std::vector<uint8_t>& vector)
    : data_(std::vector<uint8_t>(kByteData256Length)) {
  if (vector.size() != kByteData256Length) {
    warn(CFD_LOG_SOURCE, "ByteData256 size unmatch. size={}.", vector.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ByteData256 size unmatch.");
  }
  data_ = vector;
}